

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_DropInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  PClassActor *type;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  AInventory *item;
  PClassActor *pPVar4;
  char *pcVar5;
  bool bVar6;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (this->super_DThinker).super_DObject.Class;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar6) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar6 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar6) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d4de4;
        }
      }
      if (numparam == 1) {
        pcVar5 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          type = (PClassActor *)param[1].field_0.field_1.a;
          if (type != (PClassActor *)0x0) {
            pPVar4 = type;
            if (type != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
              do {
                pPVar4 = (PClassActor *)(pPVar4->super_PClass).ParentClass;
                if (pPVar4 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
              } while (pPVar4 != (PClassActor *)0x0);
              if (pPVar4 == (PClassActor *)0x0) {
                pcVar5 = "drop == NULL || drop->IsDescendantOf(RUNTIME_CLASS(AInventory))";
                goto LAB_003d4e03;
              }
            }
            item = AActor::FindInventory(this,type,false);
            if (item != (AInventory *)0x0) {
              AActor::DropInventory(this,item);
            }
          }
          return 0;
        }
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003d4e03:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe44,
                    "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d4de4:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe43,
                "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DropInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(drop, AInventory);

	if (drop)
	{
		AInventory *inv = self->FindInventory(drop);
		if (inv)
		{
			self->DropInventory(inv);
		}
	}
	return 0;
}